

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int64_t __thiscall icu_63::CEFinalizer::modifyCE32(CEFinalizer *this,uint32_t ce32)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = 0x101000100;
  if (((ce32 & 0xfe) != 0) && (0xffffffbf < (ce32 >> 8 & 0xfe) - 0x46)) {
    uVar2 = ce32 + 0xbfbff9e0;
    uVar1 = (ulong)((ce32 & 0xc0) << 8) |
            this->finalCEs[uVar2 >> 8 & 0x3f | uVar2 >> 10 & 0x1fc0 | uVar2 >> 0xb & 0xfe000];
  }
  return uVar1;
}

Assistant:

virtual int64_t modifyCE32(uint32_t ce32) const {
        U_ASSERT(!Collation::isSpecialCE32(ce32));
        if(CollationBuilder::isTempCE32(ce32)) {
            // retain case bits
            return finalCEs[CollationBuilder::indexFromTempCE32(ce32)] | ((ce32 & 0xc0) << 8);
        } else {
            return Collation::NO_CE;
        }
    }